

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::ChompCharInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompCharInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  Type pRVar2;
  uint uVar3;
  
  CVar1 = (this->super_CharMixin).c;
  pRVar2 = matcher->stats;
  if (pRVar2 != (Type)0x0) {
    pRVar2->numCompares = pRVar2->numCompares + 1;
  }
  uVar3 = *inputOffset;
  if (inputLength < uVar3) {
    inputLength = uVar3;
  }
  while( true ) {
    if (pRVar2 != (Type)0x0) {
      pRVar2->numCompares = pRVar2->numCompares + 1;
    }
    if ((inputLength == uVar3) || (input[uVar3] != CVar1)) break;
    uVar3 = uVar3 + 1;
    *inputOffset = uVar3;
  }
  *instPointer = *instPointer + 3;
  return false;
}

Assistant:

inline bool ChompCharInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }